

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O1

ssize_t ws_enc_write_head(Curl_easy *data,ws_encoder *enc,uint flags,curl_off_t payload_len,
                         bufq *out,CURLcode *err)

{
  byte *pbVar1;
  size_t sVar2;
  undefined1 uVar3;
  _Bool _Var4;
  char *fmt;
  byte bVar5;
  long lVar6;
  size_t len;
  byte *pbVar7;
  byte local_3e [10];
  byte local_34 [4];
  
  if (payload_len < 0) {
    fmt = "WS: starting new frame with negative payload length %ld";
  }
  else {
    if (enc->payload_remain < 1) {
      pbVar7 = local_3e + 2;
      pbVar1 = local_3e + 1;
      lVar6 = 4;
      do {
        if ((*(uint *)(&WS_FRAMES[0].proto_opcode + lVar6) & flags & 0xfffffffb) != 0) {
          local_3e[0] = *(byte *)((long)&Curl_handler_wss.flags + lVar6);
          goto LAB_00168779;
        }
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 100);
      local_3e[0] = 0;
LAB_00168779:
      if (local_3e[0] == 0) {
        Curl_failf(data,"WS: provided flags not recognized \'%x\'");
        goto LAB_00168711;
      }
      if ((flags & 4) == 0) {
        bVar5 = local_3e[0] | 0x80;
        local_3e[0] = 0x80;
        if (enc->contfragment == false) {
          local_3e[0] = bVar5;
        }
        _Var4 = false;
LAB_001687c2:
        enc->contfragment = _Var4;
      }
      else {
        _Var4 = true;
        if (enc->contfragment == false) goto LAB_001687c2;
        local_3e[0] = 0;
      }
      enc->firstbyte = local_3e[0];
      uVar3 = (undefined1)((ulong)payload_len >> 8);
      bVar5 = (byte)payload_len;
      if (payload_len < 0x10000) {
        if (payload_len < 0x7e) {
          bVar5 = bVar5 | 0x80;
          len = 6;
        }
        else {
          local_3e[1] = 0xfe;
          len = 8;
          pbVar1 = local_3e + 3;
          pbVar7 = local_3e + 4;
          local_3e[2] = uVar3;
        }
      }
      else {
        local_3e[1] = 0xff;
        local_3e[3] = (byte)((ulong)payload_len >> 0x30);
        local_3e[4] = (byte)((ulong)payload_len >> 0x28);
        local_3e[5] = (byte)((ulong)payload_len >> 0x20);
        local_3e[6] = (byte)((ulong)payload_len >> 0x18);
        local_3e[7] = (byte)((ulong)payload_len >> 0x10);
        len = 0xe;
        pbVar1 = local_3e + 9;
        pbVar7 = local_34;
        local_3e[2] = (char)((ulong)payload_len >> 0x38);
        local_3e[8] = uVar3;
      }
      *pbVar1 = bVar5;
      enc->payload_len = payload_len;
      enc->payload_remain = payload_len;
      ws_enc_info(enc,data,"sending");
      *(undefined4 *)pbVar7 = *(undefined4 *)enc->mask;
      enc->xori = 0;
      sVar2 = Curl_bufq_write(out,local_3e,len,err);
      if ((long)sVar2 < 0) {
        return -1;
      }
      if (sVar2 == len) {
        return sVar2;
      }
      goto LAB_00168711;
    }
    fmt = "WS: starting new frame with %zd bytes from last one remaining to be sent";
    payload_len = enc->payload_remain;
  }
  Curl_failf(data,fmt,payload_len);
LAB_00168711:
  *err = CURLE_SEND_ERROR;
  return -1;
}

Assistant:

static ssize_t ws_enc_write_head(struct Curl_easy *data,
                                 struct ws_encoder *enc,
                                 unsigned int flags,
                                 curl_off_t payload_len,
                                 struct bufq *out,
                                 CURLcode *err)
{
  unsigned char firstbyte = 0;
  unsigned char opcode;
  unsigned char head[14];
  size_t hlen;
  ssize_t n;

  if(payload_len < 0) {
    failf(data, "WS: starting new frame with negative payload length %"
                FMT_OFF_T, payload_len);
    *err = CURLE_SEND_ERROR;
    return -1;
  }

  if(enc->payload_remain > 0) {
    /* trying to write a new frame before the previous one is finished */
    failf(data, "WS: starting new frame with %zd bytes from last one "
                "remaining to be sent", (ssize_t)enc->payload_remain);
    *err = CURLE_SEND_ERROR;
    return -1;
  }

  opcode = ws_frame_flags2op((int)flags & ~CURLWS_CONT);
  if(!opcode) {
    failf(data, "WS: provided flags not recognized '%x'", flags);
    *err = CURLE_SEND_ERROR;
    return -1;
  }

  if(!(flags & CURLWS_CONT)) {
    if(!enc->contfragment)
      /* not marked as continuing, this is the final fragment */
      firstbyte |= WSBIT_FIN | opcode;
    else
      /* marked as continuing, this is the final fragment; set CONT
         opcode and FIN bit */
      firstbyte |= WSBIT_FIN | WSBIT_OPCODE_CONT;

    enc->contfragment = FALSE;
  }
  else if(enc->contfragment) {
    /* the previous fragment was not a final one and this is not either, keep a
       CONT opcode and no FIN bit */
    firstbyte |= WSBIT_OPCODE_CONT;
  }
  else {
    firstbyte = opcode;
    enc->contfragment = TRUE;
  }

  head[0] = enc->firstbyte = firstbyte;
  if(payload_len > 65535) {
    head[1] = 127 | WSBIT_MASK;
    head[2] = (unsigned char)((payload_len >> 56) & 0xff);
    head[3] = (unsigned char)((payload_len >> 48) & 0xff);
    head[4] = (unsigned char)((payload_len >> 40) & 0xff);
    head[5] = (unsigned char)((payload_len >> 32) & 0xff);
    head[6] = (unsigned char)((payload_len >> 24) & 0xff);
    head[7] = (unsigned char)((payload_len >> 16) & 0xff);
    head[8] = (unsigned char)((payload_len >> 8) & 0xff);
    head[9] = (unsigned char)(payload_len & 0xff);
    hlen = 10;
  }
  else if(payload_len >= 126) {
    head[1] = 126 | WSBIT_MASK;
    head[2] = (unsigned char)((payload_len >> 8) & 0xff);
    head[3] = (unsigned char)(payload_len & 0xff);
    hlen = 4;
  }
  else {
    head[1] = (unsigned char)payload_len | WSBIT_MASK;
    hlen = 2;
  }

  enc->payload_remain = enc->payload_len = payload_len;
  ws_enc_info(enc, data, "sending");

  /* add 4 bytes mask */
  memcpy(&head[hlen], &enc->mask, 4);
  hlen += 4;
  /* reset for payload to come */
  enc->xori = 0;

  n = Curl_bufq_write(out, head, hlen, err);
  if(n < 0)
    return -1;
  if((size_t)n != hlen) {
    /* We use a bufq with SOFT_LIMIT, writing should always succeed */
    DEBUGASSERT(0);
    *err = CURLE_SEND_ERROR;
    return -1;
  }
  return n;
}